

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O1

void __thiscall miniros::Subscription::getInfo(Subscription *this,XmlRpcValue *info)

{
  int iVar1;
  XmlRpcValue *pXVar2;
  string *value;
  pointer psVar3;
  XmlRpcValue curr_info;
  string local_80;
  pthread_mutex_t *local_60;
  string *local_58;
  XmlRpcValue local_50;
  XmlRpcValue local_40;
  
  local_60 = (pthread_mutex_t *)&this->publisher_links_mutex_;
  iVar1 = pthread_mutex_lock(local_60);
  if (iVar1 == 0) {
    psVar3 = (this->publisher_links_).
             super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar3 != (this->publisher_links_).
                  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_58 = &this->name_;
      do {
        local_50._type = TypeInvalid;
        local_50._value.asDouble = 0.0;
        local_80._M_dataplus._M_p._0_4_ =
             ((psVar3->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->connection_id_;
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,0);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_80);
        value = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                          ((psVar3->
                           super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_80,value);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,1);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_80);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_80);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,2);
        XmlRpc::XmlRpcValue::operator=(pXVar2,"i");
        (*((psVar3->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_PublisherLink[3])(&local_80);
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_80);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,3);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(uint)local_80._M_dataplus._M_p) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_80._M_dataplus._M_p._4_4_,(uint)local_80._M_dataplus._M_p),
                          local_80.field_2._M_allocated_capacity + 1);
        }
        XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_80,local_58);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,4);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(XmlRpcValue *)&local_80);
        XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_80);
        local_80._M_dataplus._M_p._0_4_ = CONCAT31(local_80._M_dataplus._M_p._1_3_,1);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,5);
        XmlRpc::XmlRpcValue::operator=(pXVar2,(bool *)&local_80);
        (*((psVar3->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_PublisherLink[4])(&local_80);
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_80);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_50,6);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._M_dataplus._M_p._4_4_,(uint)local_80._M_dataplus._M_p) !=
            &local_80.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_80._M_dataplus._M_p._4_4_,(uint)local_80._M_dataplus._M_p),
                          local_80.field_2._M_allocated_capacity + 1);
        }
        iVar1 = XmlRpc::XmlRpcValue::size(info);
        pXVar2 = XmlRpc::XmlRpcValue::operator[](info,iVar1);
        XmlRpc::XmlRpcValue::operator=(pXVar2,&local_50);
        XmlRpc::XmlRpcValue::invalidate(&local_50);
        psVar3 = psVar3 + 1;
      } while (psVar3 != (this->publisher_links_).
                         super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pthread_mutex_unlock(local_60);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Subscription::getInfo(XmlRpc::XmlRpcValue& info)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  for (V_PublisherLink::iterator c = publisher_links_.begin();
       c != publisher_links_.end(); ++c)
  {
    XmlRpcValue curr_info;
    curr_info[0] = (int)(*c)->getConnectionID();
    curr_info[1] = (*c)->getPublisherXMLRPCURI();
    curr_info[2] = "i";
    curr_info[3] = (*c)->getTransportType();
    curr_info[4] = name_;
    curr_info[5] = true; // For length compatibility with rospy
    curr_info[6] = (*c)->getTransportInfo();
    info[info.size()] = curr_info;
  }
}